

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditImageCompareTests.cpp
# Opt level: O0

void __thiscall
dit::BilinearCompareCase::BilinearCompareCase
          (BilinearCompareCase *this,TestContext *testCtx,char *name,char *refImg,char *cmpImg,
          RGBA *threshold,bool expectedResult)

{
  RGBA *__s;
  char *__s_00;
  allocator<char> local_4d [19];
  allocator<char> local_3a;
  byte local_39;
  RGBA *pRStack_38;
  bool expectedResult_local;
  RGBA *threshold_local;
  char *cmpImg_local;
  char *refImg_local;
  char *name_local;
  TestContext *testCtx_local;
  BilinearCompareCase *this_local;
  
  local_39 = expectedResult;
  pRStack_38 = threshold;
  threshold_local = (RGBA *)cmpImg;
  cmpImg_local = refImg;
  refImg_local = name;
  name_local = (char *)testCtx;
  testCtx_local = (TestContext *)this;
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,"");
  __s_00 = cmpImg_local;
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BilinearCompareCase_004014f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_refImg,__s_00,&local_3a);
  std::allocator<char>::~allocator(&local_3a);
  __s = threshold_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_cmpImg,(char *)__s,local_4d)
  ;
  std::allocator<char>::~allocator(local_4d);
  (this->m_threshold).m_value = pRStack_38->m_value;
  this->m_expectedResult = (bool)(local_39 & 1);
  return;
}

Assistant:

BilinearCompareCase (tcu::TestContext& testCtx, const char* name, const char* refImg, const char* cmpImg, const tcu::RGBA& threshold, bool expectedResult)
		: tcu::TestCase		(testCtx, name, "")
		, m_refImg			(refImg)
		, m_cmpImg			(cmpImg)
		, m_threshold		(threshold)
		, m_expectedResult	(expectedResult)
	{
	}